

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGhostObject.h
# Opt level: O1

btBroadphasePair * __thiscall
btGhostPairCallback::addOverlappingPair
          (btGhostPairCallback *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  long *plVar1;
  long *plVar2;
  
  plVar1 = (long *)proxy0->m_clientObject;
  plVar2 = (long *)0x0;
  if ((int)*(long *)((long)proxy1->m_clientObject + 0x100) == 4) {
    plVar2 = (long *)proxy1->m_clientObject;
  }
  if ((plVar1 != (long *)0x0) && ((int)plVar1[0x20] == 4)) {
    (**(code **)(*plVar1 + 0x38))(plVar1,proxy1,proxy0);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x38))(plVar2,proxy0,proxy1);
  }
  return (btBroadphasePair *)0x0;
}

Assistant:

virtual btBroadphasePair*	addOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
	{
		btCollisionObject* colObj0 = (btCollisionObject*) proxy0->m_clientObject;
		btCollisionObject* colObj1 = (btCollisionObject*) proxy1->m_clientObject;
		btGhostObject* ghost0 = 		btGhostObject::upcast(colObj0);
		btGhostObject* ghost1 = 		btGhostObject::upcast(colObj1);
		if (ghost0)
			ghost0->addOverlappingObjectInternal(proxy1, proxy0);
		if (ghost1)
			ghost1->addOverlappingObjectInternal(proxy0, proxy1);
		return 0;
	}